

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O2

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,string *value,bool param_4)

{
  cmake *cmakeInstance;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
  *this_00;
  cmListFileBacktrace backtrace;
  cmGeneratorExpression ge;
  undefined1 auStack_88 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_70;
  undefined1 local_60 [56];
  
  cmMakefile::GetBacktrace((cmMakefile *)(auStack_88 + 8));
  cmakeInstance = cmMakefile::GetCMakeInstance(mf);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_70,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)(auStack_88 + 8));
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_60,cmakeInstance,(cmListFileBacktrace *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  this_00 = (vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
               ::operator[](&this->Properties,prop);
  std::__cxx11::string::string((string *)(local_60 + 0x18),(string *)value);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)auStack_88,(string *)local_60);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
  ::
  emplace_back<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>
            (this_00,(unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      *)auStack_88);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)auStack_88);
  std::__cxx11::string::~string((string *)(local_60 + 0x18));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const std::string& value,
                                     bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(*mf->GetCMakeInstance(), backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value));
}